

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_tcp_connection.cc
# Opt level: O0

int resolve_dns(char *host,int port,sockaddr *addr)

{
  sockaddr *psVar1;
  undefined8 uVar2;
  int iVar3;
  sockaddr_in *addr_in;
  char local_88 [4];
  int ret;
  char sz_port [32];
  addrinfo *res0;
  addrinfo *res;
  addrinfo hints;
  sockaddr *addr_local;
  int port_local;
  char *host_local;
  
  hints.ai_next = (addrinfo *)addr;
  memset(local_88,0,0x20);
  snprintf(local_88,0x20,"%d",(ulong)(uint)port);
  memset(&res,0,0x30);
  res._4_4_ = 0;
  hints.ai_flags = 1;
  hints.ai_family = 6;
  res._0_4_ = 1;
  iVar3 = getaddrinfo(host,local_88,(addrinfo *)&res,(addrinfo **)(sz_port + 0x18));
  if (iVar3 == 0) {
    for (res0 = (addrinfo *)sz_port._24_8_; res0 != (addrinfo *)0x0; res0 = res0->ai_next) {
      if (res0->ai_family == 2) {
        psVar1 = res0->ai_addr;
        uVar2._0_2_ = psVar1->sa_family;
        uVar2._2_1_ = psVar1->sa_data[0];
        uVar2._3_1_ = psVar1->sa_data[1];
        uVar2._4_1_ = psVar1->sa_data[2];
        uVar2._5_1_ = psVar1->sa_data[3];
        uVar2._6_1_ = psVar1->sa_data[4];
        uVar2._7_1_ = psVar1->sa_data[5];
        (hints.ai_next)->ai_flags = (int)uVar2;
        (hints.ai_next)->ai_family = (int)((ulong)uVar2 >> 0x20);
        uVar2 = *(undefined8 *)(psVar1->sa_data + 6);
        (hints.ai_next)->ai_socktype = (int)uVar2;
        (hints.ai_next)->ai_protocol = (int)((ulong)uVar2 >> 0x20);
        break;
      }
      if (res0->ai_family == 10) {
        freeaddrinfo((addrinfo *)sz_port._24_8_);
        return -1;
      }
    }
    freeaddrinfo((addrinfo *)sz_port._24_8_);
    host_local._4_4_ = 0;
  }
  else {
    host_local._4_4_ = -1;
  }
  return host_local._4_4_;
}

Assistant:

static int resolve_dns(const char * host, int port, sockaddr* addr){
    struct addrinfo hints, *res, *res0;
    char sz_port[32] = {0};
    snprintf(sz_port, sizeof(sz_port), "%d", port);
    memset(&hints, 0, sizeof(hints));
    hints.ai_family   = PF_UNSPEC;
    hints.ai_socktype = SOCK_STREAM;
    hints.ai_protocol = IPPROTO_TCP;
    hints.ai_flags    = AI_PASSIVE;
    
    int ret = getaddrinfo(host, sz_port, &hints, &res0);
    if (ret != 0) {
      return -1;
    }
    
    for(res = res0; res; res = res->ai_next){
        if(res->ai_family == AF_INET){
          sockaddr_in* addr_in = (sockaddr_in*)res->ai_addr;
          memcpy(addr, res->ai_addr, sizeof(sockaddr_in));
         
          break;
        }else if(res->ai_family == AF_INET6){
          freeaddrinfo(res0);
          return -1;
        }
    }
    freeaddrinfo(res0);
    return 0;
}